

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool vec2_lines_intersect(vec2 line0_p0,vec2 line0_p1,vec2 line1_p0,vec2 line1_p1)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  bool local_2d;
  _Bool left4;
  _Bool left3;
  _Bool left2;
  _Bool left1;
  vec2 line1_p1_local;
  vec2 line1_p0_local;
  vec2 line0_p1_local;
  vec2 line0_p0_local;
  
  _Var1 = vec2_point_left_of_line(line0_p0,line1_p0,line1_p1);
  _Var2 = vec2_point_left_of_line(line0_p1,line1_p0,line1_p1);
  _Var3 = vec2_point_left_of_line(line1_p0,line0_p0,line0_p1);
  _Var4 = vec2_point_left_of_line(line1_p1,line0_p0,line0_p1);
  local_2d = _Var1 != _Var2 && _Var3 != _Var4;
  return local_2d;
}

Assistant:

bool vec2_lines_intersect(vec2 line0_p0, vec2 line0_p1, vec2 line1_p0, vec2 line1_p1) {
    bool left1 = vec2_point_left_of_line(line0_p0, line1_p0, line1_p1);
    bool left2 = vec2_point_left_of_line(line0_p1, line1_p0, line1_p1);
    bool left3 = vec2_point_left_of_line(line1_p0, line0_p0, line0_p1);
    bool left4 = vec2_point_left_of_line(line1_p1, line0_p0, line0_p1);
    return (left1 != left2) && (left3 != left4);
}